

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairing.c
# Opt level: O2

int compute_6tplus2_naf(int **naf,int *naf_len,fp_struct_st *t)

{
  size_t size;
  uint uVar1;
  int iVar2;
  BIGNUM *a;
  int *__src;
  int *__dest;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  
  a = BN_new();
  if (a == (BIGNUM *)0x0) {
    __src = (int *)0x0;
    __dest = (int *)0x0;
  }
  else {
    BN_set_words((BIGNUM *)a,t->d,4);
    BN_mul_word(a,6);
    BN_add_word(a,2);
    uVar1 = BN_num_bits(a);
    if ((int)uVar1 < 1) {
      __src = (int *)0x0;
      __dest = (int *)0x0;
    }
    else {
      uVar5 = (ulong)uVar1;
      size = uVar5 * 4 + 4;
      __src = (int *)CRYPTO_zalloc(size);
      __dest = (int *)CRYPTO_zalloc(size);
      if (__dest != (int *)0x0 && __src != (int *)0x0) {
        piVar6 = __src;
        uVar8 = uVar5;
        while (uVar8 != 0) {
          iVar2 = BN_is_bit_set(a,(int)uVar8);
          *piVar6 = iVar2;
          piVar6 = piVar6 + 1;
          uVar8 = uVar8 - 1;
        }
        uVar3 = uVar1;
        do {
          uVar7 = uVar3;
          if ((int)uVar3 < 1) {
            if (*__src == 1) {
              memcpy(__dest,__src,size);
              uVar1 = uVar1 + 1;
            }
            else {
              memcpy(__dest,__src + 1,uVar5 << 2);
            }
            *naf = __dest;
            *naf_len = uVar1;
            CRYPTO_free(__src);
            BN_free(a);
            return 1;
          }
          for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
            if (__src[uVar7] != 1) goto LAB_0011c555;
          }
          uVar7 = 0;
          if (2 < (int)uVar3) {
            lVar4 = (ulong)uVar3 + 1;
            iVar2 = -1;
            do {
              __src[lVar4 + -1] = iVar2;
              lVar4 = lVar4 + -1;
              iVar2 = 0;
            } while (1 < lVar4);
            *__src = 1;
            uVar7 = 0;
            uVar3 = 0;
          }
LAB_0011c555:
          if ((int)(uVar3 - uVar7) < 2) {
            uVar3 = uVar3 - 1;
          }
          else {
            piVar6 = __src + 1 + (int)(uVar3 - 1);
            iVar2 = -1;
            do {
              __src[uVar3] = iVar2;
              uVar3 = uVar3 - 1;
              piVar6 = piVar6 + -1;
              iVar2 = 0;
            } while ((int)uVar7 < (int)uVar3);
            *piVar6 = 1;
          }
        } while( true );
      }
    }
  }
  *naf = (int *)0x0;
  *naf_len = 0;
  CRYPTO_free(__src);
  CRYPTO_free(__dest);
  BN_free(a);
  return 0;
}

Assistant:

int compute_6tplus2_naf(int **naf, int *naf_len, fp_t t)
{
    int bits, i, j;
    int *tmp = NULL;
    int *ret = NULL;
    BIGNUM *z = NULL;

    z = BN_new();
    if (z == NULL)
        goto end;

    BN_set_words(z, t->d, N_LIMBS);
    BN_mul_word(z, 6);
    BN_add_word(z, 2);
    bits = BN_num_bits(z);
    if (bits <= 0)
        goto end;

    tmp = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    ret = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    if (tmp == NULL || ret == NULL)
        goto end;

    for (i = 0; i < bits; i++)
        tmp[i] = BN_is_bit_set(z, bits - i);

    i = bits;
    while (i > 0) {
        j = i;
        while (j > 0 && tmp[j] == 1)
            j--;

        if (j == 0) {
            if ((i - j) >= 3) {
                tmp[i] = -1;
                i--;
                while (i > j) {
                    tmp[i] = 0;
                    i--;
                }
                tmp[i] = 1;
            }
        }

        /* ***11*** --> **10-1*** */
        if ((i - j) >= 2) {
            tmp[i] = -1;
            i--;
            while (i > j) {
                tmp[i] = 0;
                i--;
            }
            tmp[i] = 1;
        }
        else
            i--;
    }

    if (tmp[0] == 1) {
        memcpy(ret, tmp, (bits + 1) * sizeof(int));
        *naf = ret;
        *naf_len = (bits + 1);
    }
    else {
        memcpy(ret, tmp + 1, bits * sizeof(int));
        *naf = ret;
        *naf_len = bits;
    }

    CRYPTO_free(tmp);
    BN_free(z);
    return GML_OK;
end:
    *naf = NULL;
    *naf_len = 0;
    CRYPTO_free(tmp);
    CRYPTO_free(ret);
    BN_free(z);
    return GML_ERROR;
}